

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O0

bool __thiscall
google::protobuf::SimpleDescriptorDatabase::
DescriptorIndex<const_google::protobuf::FileDescriptorProto_*>::AddFile
          (DescriptorIndex<const_google::protobuf::FileDescriptorProto_*> *this,
          FileDescriptorProto *file,FileDescriptorProto *value)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  string *psVar4;
  LogMessage *pLVar5;
  ulong uVar6;
  DescriptorProto *pDVar7;
  EnumDescriptorProto *this_00;
  FieldDescriptorProto *pFVar8;
  ServiceDescriptorProto *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  int local_10c;
  undefined1 local_108 [4];
  int i_3;
  int local_e4;
  undefined1 local_e0 [4];
  int i_2;
  int local_c0;
  undefined4 local_bc;
  int i_1;
  int local_94;
  undefined1 local_90 [4];
  int i;
  string path;
  LogMessage local_60;
  FileDescriptorProto *local_28;
  FileDescriptorProto *value_local;
  FileDescriptorProto *file_local;
  DescriptorIndex<const_google::protobuf::FileDescriptorProto_*> *this_local;
  
  local_28 = value;
  value_local = file;
  file_local = (FileDescriptorProto *)this;
  psVar4 = FileDescriptorProto::name_abi_cxx11_(file);
  bVar2 = InsertIfNotPresent<std::map<std::__cxx11::string,google::protobuf::FileDescriptorProto_const*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::FileDescriptorProto_const*>>>,std::__cxx11::string,google::protobuf::FileDescriptorProto_const*>
                    (&this->by_name_,psVar4,&local_28);
  if (bVar2) {
    bVar2 = FileDescriptorProto::has_package(value_local);
    if (bVar2) {
      psVar4 = FileDescriptorProto::package_abi_cxx11_(value_local);
      std::__cxx11::string::string((string *)local_90,(string *)psVar4);
    }
    else {
      std::__cxx11::string::string((string *)local_90);
    }
    uVar6 = std::__cxx11::string::empty();
    if ((uVar6 & 1) == 0) {
      std::__cxx11::string::operator+=((string *)local_90,'.');
    }
    local_94 = 0;
    while( true ) {
      iVar1 = local_94;
      iVar3 = FileDescriptorProto::message_type_size(value_local);
      if (iVar3 <= iVar1) break;
      pDVar7 = FileDescriptorProto::message_type(value_local,local_94);
      psVar4 = DescriptorProto::name_abi_cxx11_(pDVar7);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&i_1,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90,
                     psVar4);
      bVar2 = AddSymbol(this,(string *)&i_1,local_28);
      std::__cxx11::string::~string((string *)&i_1);
      if (((bVar2 ^ 0xffU) & 1) != 0) {
        this_local._7_1_ = 0;
        goto LAB_00314d5d;
      }
      pDVar7 = FileDescriptorProto::message_type(value_local,local_94);
      bVar2 = AddNestedExtensions(this,pDVar7,local_28);
      if (!bVar2) {
        this_local._7_1_ = 0;
        goto LAB_00314d5d;
      }
      local_94 = local_94 + 1;
    }
    local_c0 = 0;
    while( true ) {
      iVar1 = local_c0;
      iVar3 = FileDescriptorProto::enum_type_size(value_local);
      if (iVar3 <= iVar1) break;
      this_00 = FileDescriptorProto::enum_type(value_local,local_c0);
      psVar4 = EnumDescriptorProto::name_abi_cxx11_(this_00);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90,
                     psVar4);
      bVar2 = AddSymbol(this,(string *)local_e0,local_28);
      std::__cxx11::string::~string((string *)local_e0);
      if (((bVar2 ^ 0xffU) & 1) != 0) {
        this_local._7_1_ = 0;
        goto LAB_00314d5d;
      }
      local_c0 = local_c0 + 1;
    }
    local_e4 = 0;
    while( true ) {
      iVar1 = local_e4;
      iVar3 = FileDescriptorProto::extension_size(value_local);
      if (iVar3 <= iVar1) break;
      pFVar8 = FileDescriptorProto::extension(value_local,local_e4);
      psVar4 = FieldDescriptorProto::name_abi_cxx11_(pFVar8);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90,
                     psVar4);
      bVar2 = AddSymbol(this,(string *)local_108,local_28);
      std::__cxx11::string::~string((string *)local_108);
      if (((bVar2 ^ 0xffU) & 1) != 0) {
        this_local._7_1_ = 0;
        goto LAB_00314d5d;
      }
      pFVar8 = FileDescriptorProto::extension(value_local,local_e4);
      bVar2 = AddExtension(this,pFVar8,local_28);
      if (!bVar2) {
        this_local._7_1_ = 0;
        goto LAB_00314d5d;
      }
      local_e4 = local_e4 + 1;
    }
    local_10c = 0;
    while( true ) {
      iVar1 = local_10c;
      iVar3 = FileDescriptorProto::service_size(value_local);
      if (iVar3 <= iVar1) break;
      this_01 = FileDescriptorProto::service(value_local,local_10c);
      psVar4 = ServiceDescriptorProto::name_abi_cxx11_(this_01);
      std::operator+(&local_130,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90,
                     psVar4);
      bVar2 = AddSymbol(this,&local_130,local_28);
      std::__cxx11::string::~string((string *)&local_130);
      if (((bVar2 ^ 0xffU) & 1) != 0) {
        this_local._7_1_ = 0;
        goto LAB_00314d5d;
      }
      local_10c = local_10c + 1;
    }
    this_local._7_1_ = 1;
LAB_00314d5d:
    local_bc = 1;
    std::__cxx11::string::~string((string *)local_90);
  }
  else {
    internal::LogMessage::LogMessage
              (&local_60,LOGLEVEL_ERROR,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/descriptor_database.cc"
               ,0x39);
    pLVar5 = internal::LogMessage::operator<<(&local_60,"File already exists in database: ");
    psVar4 = FileDescriptorProto::name_abi_cxx11_(value_local);
    pLVar5 = internal::LogMessage::operator<<(pLVar5,psVar4);
    internal::LogFinisher::operator=((LogFinisher *)(path.field_2._M_local_buf + 0xb),pLVar5);
    internal::LogMessage::~LogMessage(&local_60);
    this_local._7_1_ = 0;
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool SimpleDescriptorDatabase::DescriptorIndex<Value>::AddFile(
    const FileDescriptorProto& file,
    Value value) {
  if (!InsertIfNotPresent(&by_name_, file.name(), value)) {
    GOOGLE_LOG(ERROR) << "File already exists in database: " << file.name();
    return false;
  }

  // We must be careful here -- calling file.package() if file.has_package() is
  // false could access an uninitialized static-storage variable if we are being
  // run at startup time.
  string path = file.has_package() ? file.package() : string();
  if (!path.empty()) path += '.';

  for (int i = 0; i < file.message_type_size(); i++) {
    if (!AddSymbol(path + file.message_type(i).name(), value)) return false;
    if (!AddNestedExtensions(file.message_type(i), value)) return false;
  }
  for (int i = 0; i < file.enum_type_size(); i++) {
    if (!AddSymbol(path + file.enum_type(i).name(), value)) return false;
  }
  for (int i = 0; i < file.extension_size(); i++) {
    if (!AddSymbol(path + file.extension(i).name(), value)) return false;
    if (!AddExtension(file.extension(i), value)) return false;
  }
  for (int i = 0; i < file.service_size(); i++) {
    if (!AddSymbol(path + file.service(i).name(), value)) return false;
  }

  return true;
}